

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

TableGrow * __thiscall
wasm::Builder::makeTableGrow(Builder *this,Name table,Expression *value,Expression *delta)

{
  Name tableName;
  bool bVar1;
  Type local_50;
  Builder *local_48;
  size_t local_40;
  TableGrow *local_38;
  TableGrow *ret;
  Expression *delta_local;
  Expression *value_local;
  Builder *this_local;
  Name table_local;
  
  table_local.super_IString.str._M_len = table.super_IString.str._M_str;
  this_local = table.super_IString.str._M_len;
  ret = (TableGrow *)delta;
  delta_local = value;
  value_local = (Expression *)this;
  local_38 = MixedArena::alloc<wasm::TableGrow>(&this->wasm->allocator);
  wasm::Name::operator=(&local_38->table,(Name *)&this_local);
  local_38->value = delta_local;
  local_38->delta = (Expression *)ret;
  local_48 = this_local;
  local_40 = table_local.super_IString.str._M_len;
  tableName.super_IString.str._M_str = (char *)table_local.super_IString.str._M_len;
  tableName.super_IString.str._M_len = (size_t)this_local;
  bVar1 = isTable64(this,tableName);
  if (bVar1) {
    wasm::Type::Type(&local_50,i64);
    (local_38->super_SpecificExpression<(wasm::Expression::Id)48>).super_Expression.type.id =
         local_50.id;
  }
  TableGrow::finalize(local_38);
  return local_38;
}

Assistant:

TableGrow* makeTableGrow(Name table, Expression* value, Expression* delta) {
    auto* ret = wasm.allocator.alloc<TableGrow>();
    ret->table = table;
    ret->value = value;
    ret->delta = delta;
    if (isTable64(table)) {
      ret->type = Type::i64;
    }
    ret->finalize();
    return ret;
  }